

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

int CompareMat(Mat *a,Mat *b,float epsilon)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  char *__format;
  ulong uVar10;
  void *pvVar11;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  Mat local_98;
  Option local_58;
  
  if (a->elempack == 1) {
    if (b->elempack == 1) {
      uVar12 = a->elemsize;
      if (uVar12 == 1) {
        local_98.elemsize._0_4_ = 0;
        local_98._20_8_ = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
        ncnn::Option::Option(&local_58);
        ncnn::cast_int8_to_float32(a,&local_98,&local_58);
        iVar5 = CompareMat(&local_98,b,epsilon);
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar4 == (int *)0x0) {
          return iVar5;
        }
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 != 0) {
          return iVar5;
        }
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          return iVar5;
        }
      }
      else if (uVar12 == 2) {
        local_98.elemsize._0_4_ = 0;
        local_98._20_8_ = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
        ncnn::Option::Option(&local_58);
        ncnn::cast_float16_to_float32(a,&local_98,&local_58);
        iVar5 = CompareMat(&local_98,b,epsilon);
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar4 == (int *)0x0) {
          return iVar5;
        }
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 != 0) {
          return iVar5;
        }
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          return iVar5;
        }
      }
      else {
        uVar6 = b->elemsize;
        if (uVar6 == 1) {
          local_98.elemsize._0_4_ = 0;
          local_98._20_8_ = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.c = 0;
          local_98.cstep = 0;
          ncnn::Option::Option(&local_58);
          ncnn::cast_int8_to_float32(b,&local_98,&local_58);
          iVar5 = CompareMat(a,&local_98,epsilon);
          piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (piVar4 == (int *)0x0) {
            return iVar5;
          }
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 != 0) {
            return iVar5;
          }
          if (local_98.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_98.allocator + 0x18))();
            return iVar5;
          }
        }
        else {
          if (uVar6 != 2) {
            uVar8 = (ulong)(uint)a->dims;
            uVar7 = (ulong)(uint)b->dims;
            if (a->dims == b->dims) {
              uVar8 = (ulong)(uint)a->w;
              uVar7 = (ulong)(uint)b->w;
              if (a->w == b->w) {
                uVar8 = (ulong)(uint)a->h;
                uVar7 = (ulong)(uint)b->h;
                if (a->h == b->h) {
                  uVar3 = a->c;
                  uVar8 = (ulong)uVar3;
                  uVar7 = (ulong)(uint)b->c;
                  if (uVar3 == b->c) {
                    if (uVar12 == uVar6) {
                      if ((int)uVar3 < 1) {
                        return 0;
                      }
                      uVar12 = 0;
                      do {
                        uVar6 = (ulong)a->h;
                        if (0 < (long)uVar6) {
                          uVar3 = a->w;
                          pvVar9 = (void *)(b->elemsize * b->cstep * uVar12 + (long)b->data);
                          pvVar11 = (void *)(a->cstep * a->elemsize * uVar12 + (long)a->data);
                          bVar13 = true;
                          uVar7 = 0;
                          do {
                            if (0 < (int)uVar3) {
                              uVar10 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar11 + uVar10 * 4);
                                fVar2 = *(float *)((long)pvVar9 + uVar10 * 4);
                                if (((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) &&
                                   (epsilon < ABS(fVar1 - fVar2))) {
                                  fVar14 = ABS(fVar2);
                                  if (ABS(fVar2) <= ABS(fVar1)) {
                                    fVar14 = ABS(fVar1);
                                  }
                                  if (fVar14 * epsilon <= ABS(fVar1 - fVar2)) {
                                    fprintf(_stderr,
                                            "value not match  at c:%d h:%d w:%d    expect %f but got %f\n"
                                            ,SUB84((double)fVar1,0),(double)fVar2,
                                            uVar12 & 0xffffffff);
                                    if (bVar13) {
                                      return -1;
                                    }
                                    uVar8 = (ulong)(uint)a->c;
                                    goto LAB_00113869;
                                  }
                                }
                                uVar10 = uVar10 + 1;
                              } while (uVar3 != uVar10);
                            }
                            uVar7 = uVar7 + 1;
                            pvVar9 = (void *)((long)pvVar9 + (long)b->w * b->elemsize);
                            pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar3 * a->elemsize);
                            bVar13 = uVar7 < uVar6;
                          } while (uVar7 != uVar6);
                        }
LAB_00113869:
                        uVar12 = uVar12 + 1;
                        if ((long)(int)uVar8 <= (long)uVar12) {
                          return 0;
                        }
                      } while( true );
                    }
                    __format = "elemsize not match    expect %d but got %d\n";
                    uVar8 = uVar12 & 0xffffffff;
                    uVar7 = uVar6;
                  }
                  else {
                    __format = "c not match    expect %d but got %d\n";
                  }
                }
                else {
                  __format = "h not match    expect %d but got %d\n";
                }
              }
              else {
                __format = "w not match    expect %d but got %d\n";
              }
            }
            else {
              __format = "dims not match    expect %d but got %d\n";
            }
            fprintf(_stderr,__format,uVar8,uVar7);
            return -1;
          }
          local_98.elemsize._0_4_ = 0;
          local_98._20_8_ = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.c = 0;
          local_98.cstep = 0;
          ncnn::Option::Option(&local_58);
          ncnn::cast_float16_to_float32(b,&local_98,&local_58);
          iVar5 = CompareMat(a,&local_98,epsilon);
          piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (piVar4 == (int *)0x0) {
            return iVar5;
          }
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 != 0) {
            return iVar5;
          }
          if (local_98.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_98.allocator + 0x18))();
            return iVar5;
          }
        }
      }
    }
    else {
      local_98.elemsize._0_4_ = 0;
      local_98._20_8_ = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.c = 0;
      local_98.cstep = 0;
      ncnn::Option::Option(&local_58);
      ncnn::convert_packing(b,&local_98,1,&local_58);
      iVar5 = CompareMat(a,&local_98,epsilon);
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar4 == (int *)0x0) {
        return iVar5;
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) {
        return iVar5;
      }
      if (local_98.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
        return iVar5;
      }
    }
  }
  else {
    local_98.elemsize._0_4_ = 0;
    local_98._20_8_ = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.c = 0;
    local_98.cstep = 0;
    ncnn::Option::Option(&local_58);
    ncnn::convert_packing(a,&local_98,1,&local_58);
    iVar5 = CompareMat(&local_98,b,epsilon);
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar4 == (int *)0x0) {
      return iVar5;
    }
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) {
      return iVar5;
    }
    if (local_98.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_98.allocator + 0x18))();
      return iVar5;
    }
  }
  if (local_98.data != (void *)0x0) {
    free(local_98.data);
  }
  return iVar5;
}

Assistant:

static int CompareMat(const ncnn::Mat& a, const ncnn::Mat& b, float epsilon = 0.001)
{
    if (a.elempack != 1)
    {
        ncnn::Mat a1;
        ncnn::convert_packing(a, a1, 1);
        return CompareMat(a1, b, epsilon);
    }

    if (b.elempack != 1)
    {
        ncnn::Mat b1;
        ncnn::convert_packing(b, b1, 1);
        return CompareMat(a, b1, epsilon);
    }

    if (a.elemsize == 2u)
    {
        ncnn::Mat a32;
        cast_float16_to_float32(a, a32);
        return CompareMat(a32, b, epsilon);
    }
    if (a.elemsize == 1u)
    {
        ncnn::Mat a32;
        cast_int8_to_float32(a, a32);
        return CompareMat(a32, b, epsilon);
    }

    if (b.elemsize == 2u)
    {
        ncnn::Mat b32;
        cast_float16_to_float32(b, b32);
        return CompareMat(a, b32, epsilon);
    }
    if (b.elemsize == 1u)
    {
        ncnn::Mat b32;
        cast_int8_to_float32(b, b32);
        return CompareMat(a, b32, epsilon);
    }

    return Compare(a, b, epsilon);
}